

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O3

bool anyFeatureDescriptionOfDescription<CoreML::Specification::ModelDescription>
               (ModelDescription *description,
               function<bool_(const_CoreML::Specification::FeatureDescription_&)> *criteria)

{
  uint32_t uVar1;
  Rep *pRVar2;
  bool bVar3;
  undefined1 *puVar4;
  FeatureDescription *pFVar5;
  long lVar6;
  long lVar7;
  void **ppvVar8;
  bool bVar9;
  
  pRVar2 = (description->input_).super_RepeatedPtrFieldBase.rep_;
  ppvVar8 = pRVar2->elements;
  if (pRVar2 == (Rep *)0x0) {
    ppvVar8 = (void **)0x0;
  }
  lVar6 = (long)(description->input_).super_RepeatedPtrFieldBase.current_size_;
  pFVar5 = (FeatureDescription *)criteria;
  if (lVar6 != 0) {
    lVar7 = 0;
    do {
      if ((criteria->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_002d93d7;
      pFVar5 = *(FeatureDescription **)((long)ppvVar8 + lVar7);
      bVar3 = (*criteria->_M_invoker)((_Any_data *)criteria,pFVar5);
      if (bVar3) {
        return true;
      }
      lVar7 = lVar7 + 8;
    } while (lVar6 * 8 != lVar7);
  }
  pRVar2 = (description->output_).super_RepeatedPtrFieldBase.rep_;
  ppvVar8 = pRVar2->elements;
  if (pRVar2 == (Rep *)0x0) {
    ppvVar8 = (void **)0x0;
  }
  lVar6 = (long)(description->output_).super_RepeatedPtrFieldBase.current_size_;
  if (lVar6 != 0) {
    lVar7 = 0;
    do {
      if ((criteria->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_002d93d7;
      pFVar5 = *(FeatureDescription **)((long)ppvVar8 + lVar7);
      bVar3 = (*criteria->_M_invoker)((_Any_data *)criteria,pFVar5);
      if (bVar3) {
        return true;
      }
      lVar7 = lVar7 + 8;
    } while (lVar6 * 8 != lVar7);
  }
  pRVar2 = (description->state_).super_RepeatedPtrFieldBase.rep_;
  ppvVar8 = pRVar2->elements;
  if (pRVar2 == (Rep *)0x0) {
    ppvVar8 = (void **)0x0;
  }
  lVar6 = (long)(description->state_).super_RepeatedPtrFieldBase.current_size_;
  if (lVar6 == 0) {
    bVar3 = false;
  }
  else {
    lVar7 = 0;
    do {
      if ((criteria->super__Function_base)._M_manager == (_Manager_type)0x0) {
LAB_002d93d7:
        std::__throw_bad_function_call();
        puVar4 = (undefined1 *)pFVar5->type_;
        if ((FeatureType *)puVar4 == (FeatureType *)0x0) {
          puVar4 = CoreML::Specification::_FeatureType_default_instance_;
        }
        if (((FeatureType *)puVar4)->_oneof_case_[0] == 4) {
          uVar1 = ((((FeatureType *)puVar4)->Type_).imagetype_)->_oneof_case_[0];
        }
        else {
          if (((FeatureType *)puVar4)->_oneof_case_[0] != 5) {
            return false;
          }
          uVar1 = ((((FeatureType *)puVar4)->Type_).multiarraytype_)->_oneof_case_[0];
        }
        if (uVar1 != 0) {
          return true;
        }
        return false;
      }
      pFVar5 = *(FeatureDescription **)((long)ppvVar8 + lVar7);
      bVar3 = (*criteria->_M_invoker)((_Any_data *)criteria,pFVar5);
    } while ((!bVar3) && (bVar9 = lVar6 * 8 + -8 != lVar7, lVar7 = lVar7 + 8, bVar9));
  }
  return bVar3;
}

Assistant:

static bool anyFeatureDescriptionOfDescription(const Description &description,
                                               std::function<bool(const Specification::FeatureDescription& fd)> criteria) {
    for (const auto& fd: description.input()) {
        if (criteria(fd)) {
            return true;
        }
    }

    for (const auto& fd: description.output()) {
        if (criteria(fd)) {
            return true;
        }
    }

    for (const auto& fd: description.state()) {
        if (criteria(fd)) {
            return true;
        }
    }
    return false;
}